

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O2

void stats_print(_func_void_void_ptr_char_ptr *write_cb,void *cbopaque,char *opts)

{
  char cVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  uint64_t *oldp;
  uint uVar5;
  undefined8 extraout_RDX;
  char *format;
  char *pcVar6;
  undefined7 uVar8;
  undefined8 uVar7;
  undefined8 in_R9;
  undefined7 uVar10;
  undefined8 uVar9;
  undefined8 in_R10;
  undefined7 uVar12;
  undefined8 uVar11;
  undefined8 in_R11;
  undefined7 uVar14;
  undefined8 uVar13;
  undefined4 uVar15;
  ulong uVar16;
  undefined8 unaff_R13;
  undefined7 uVar17;
  _Bool bv;
  _Bool bv2;
  size_t bsz;
  emitter_t emitter;
  char *cpv;
  size_t miblen;
  ssize_t ssv;
  size_t sv;
  size_t sssz;
  size_t cpsz;
  undefined4 local_d8;
  uint local_d4;
  undefined4 local_d0;
  uint uv;
  size_t sz_19;
  uint nlextents;
  uint nbins;
  size_t ssz;
  undefined4 local_ac;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined4 local_a0;
  uint nhbins;
  size_t sz;
  ulong local_88;
  ssize_t ssv2;
  size_t usz;
  uint32_t u32v;
  size_t u64sz;
  uint64_t epoch;
  
  oldp = &epoch;
  epoch = 1;
  u64sz = 8;
  uVar7 = 0;
  iVar4 = je_mallctl("epoch",oldp,&u64sz,oldp,8);
  if (iVar4 != 0) {
    if (iVar4 == 0xb) {
      malloc_write("<jemalloc>: Memory allocation failure in mallctl(\"epoch\", ...)\n");
      return;
    }
    pcVar6 = "<jemalloc>: Failure in mallctl(\"epoch\", ...)\n";
    goto LAB_00135f7b;
  }
  uVar14 = (undefined7)((ulong)in_R11 >> 8);
  uVar12 = (undefined7)((ulong)in_R10 >> 8);
  uVar10 = (undefined7)((ulong)in_R9 >> 8);
  uVar8 = (undefined7)((ulong)uVar7 >> 8);
  uVar17 = (undefined7)((ulong)unaff_R13 >> 8);
  if (opts != (char *)0x0) {
    bVar3 = 0;
    bVar2 = true;
    uVar13 = CONCAT71(uVar14,1);
    uVar11 = CONCAT71(uVar12,1);
    uVar9 = CONCAT71(uVar10,1);
    uVar7 = CONCAT71(uVar8,1);
    uVar16 = CONCAT71(uVar17,1);
    uVar15 = 1;
    local_d0 = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
    uVar5 = 0;
    do {
      local_a0 = (undefined4)uVar7;
      local_a4 = (undefined4)uVar9;
      local_a8 = (undefined4)uVar11;
      local_ac = (undefined4)uVar13;
      cVar1 = opts[uVar5];
      switch(cVar1) {
      case 'a':
        uVar9 = 0;
        break;
      case 'b':
        uVar7 = 0;
        break;
      case 'c':
      case 'f':
      case 'h':
      case 'i':
      case 'j':
      case 'k':
        break;
      case 'd':
        uVar11 = 0;
        break;
      case 'e':
        local_d0 = 0;
        break;
      case 'g':
        bVar2 = false;
        break;
      case 'l':
        uVar16 = 0;
        break;
      case 'm':
        uVar13 = 0;
        break;
      default:
        if (cVar1 == 'J') {
          bVar3 = 1;
        }
        else if (cVar1 == 'x') {
          uVar15 = 0;
        }
        else if (cVar1 == '\0') goto LAB_00134ac6;
      }
      uVar5 = uVar5 + 1;
    } while( true );
  }
  bVar2 = true;
  emitter.output = emitter_output_table;
  local_ac = (undefined4)CONCAT71(uVar14,1);
  local_a8 = (undefined4)CONCAT71(uVar12,1);
  local_a4 = (undefined4)CONCAT71(uVar10,1);
  local_a0 = (undefined4)CONCAT71(uVar8,1);
  uVar16 = CONCAT71(uVar17,1);
  uVar15 = 1;
  local_d0 = (undefined4)CONCAT71((int7)((ulong)oldp >> 8),1);
  goto LAB_00134af3;
LAB_00135f74:
  pcVar6 = "<jemalloc>: Failure in xmallctlbymib()\n";
LAB_00135f7b:
  malloc_write(pcVar6);
  abort();
LAB_00134ac6:
  emitter.output = (emitter_output_t)(~bVar3 & 1);
LAB_00134af3:
  emitter.item_at_depth = false;
  emitter.emitted_key = false;
  emitter.nesting_depth = 0;
  emitter.write_cb = write_cb;
  emitter.cbopaque = cbopaque;
  if (emitter.output == emitter_output_json) {
    emitter_printf(&emitter,"{");
    emitter.nesting_depth = emitter.nesting_depth + 1;
    emitter._28_2_ = emitter._28_2_ & 0xff00;
  }
  else {
    emitter_printf(&emitter,"%s","");
  }
  emitter_table_printf(&emitter,"___ Begin jemalloc statistics ___\n");
  emitter_json_object_kv_begin(&emitter,"jemalloc");
  if (!bVar2) {
LAB_00135ed1:
    stats_print_helper(&emitter,(_Bool)((byte)local_ac & 1),(_Bool)((byte)local_a8 & 1),
                       (_Bool)((byte)local_a4 & 1),(_Bool)((byte)local_a0 & 1),
                       (_Bool)((byte)uVar16 & 1),(_Bool)((byte)uVar15 & 1),
                       (_Bool)((byte)local_d0 & 1));
    emitter_json_object_end(&emitter);
    emitter_table_printf(&emitter,"--- End jemalloc statistics ---\n");
    if (emitter.output == emitter_output_json) {
      emitter.nesting_depth = emitter.nesting_depth + -1;
      emitter.item_at_depth = true;
      emitter_printf(&emitter,"\n}\n");
    }
    return;
  }
  bsz = 1;
  usz = 4;
  ssz = 8;
  sssz = 8;
  cpsz = 8;
  sz = 8;
  iVar4 = je_mallctl("version",&cpv,&sz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv(&emitter,"version","Version",emitter_type_string,&cpv);
    emitter_dict_begin(&emitter,"config","Build-time option settings");
    sz = 1;
    iVar4 = je_mallctl("config.cache_oblivious",&bv,&sz,(void *)0x0,0);
    if (iVar4 == 0) {
      emitter_kv(&emitter,"cache_oblivious","config.cache_oblivious",emitter_type_bool,&bv);
      sz = 1;
      iVar4 = je_mallctl("config.debug",&bv,&sz,(void *)0x0,0);
      if (iVar4 == 0) {
        emitter_kv(&emitter,"debug","config.debug",emitter_type_bool,&bv);
        sz = 1;
        iVar4 = je_mallctl("config.fill",&bv,&sz,(void *)0x0,0);
        if (iVar4 == 0) {
          emitter_kv(&emitter,"fill","config.fill",emitter_type_bool,&bv);
          sz = 1;
          iVar4 = je_mallctl("config.lazy_lock",&bv,&sz,(void *)0x0,0);
          if (iVar4 == 0) {
            emitter_kv(&emitter,"lazy_lock","config.lazy_lock",emitter_type_bool,&bv);
            emitter_kv(&emitter,"malloc_conf","config.malloc_conf",emitter_type_string,
                       &config_malloc_conf);
            sz = 1;
            iVar4 = je_mallctl("config.opt_safety_checks",&bv,&sz,(void *)0x0,0);
            if (iVar4 == 0) {
              emitter_kv(&emitter,"opt_safety_checks","config.opt_safety_checks",emitter_type_bool,
                         &bv);
              sz = 1;
              iVar4 = je_mallctl("config.prof",&bv,&sz,(void *)0x0,0);
              if (iVar4 == 0) {
                emitter_kv(&emitter,"prof","config.prof",emitter_type_bool,&bv);
                sz = 1;
                iVar4 = je_mallctl("config.prof_libgcc",&bv,&sz,(void *)0x0,0);
                if (iVar4 == 0) {
                  emitter_kv(&emitter,"prof_libgcc","config.prof_libgcc",emitter_type_bool,&bv);
                  sz = 1;
                  iVar4 = je_mallctl("config.prof_libunwind",&bv,&sz,(void *)0x0,0);
                  if (iVar4 == 0) {
                    emitter_kv(&emitter,"prof_libunwind","config.prof_libunwind",emitter_type_bool,
                               &bv);
                    sz = 1;
                    iVar4 = je_mallctl("config.stats",&bv,&sz,(void *)0x0,0);
                    if (iVar4 == 0) {
                      emitter_kv(&emitter,"stats","config.stats",emitter_type_bool,&bv);
                      sz = 1;
                      iVar4 = je_mallctl("config.utrace",&bv,&sz,(void *)0x0,0);
                      if (iVar4 == 0) {
                        emitter_kv(&emitter,"utrace","config.utrace",emitter_type_bool,&bv);
                        sz = 1;
                        iVar4 = je_mallctl("config.xmalloc",&bv,&sz,(void *)0x0,0);
                        if (iVar4 == 0) {
                          emitter_kv(&emitter,"xmalloc","config.xmalloc",emitter_type_bool,&bv);
                          emitter_dict_end(&emitter);
                          emitter_dict_begin(&emitter,"opt","Run-time option settings");
                          iVar4 = je_mallctl("opt.abort",&bv,&bsz,(void *)0x0,0);
                          if (iVar4 == 0) {
                            emitter_kv(&emitter,"abort","opt.abort",emitter_type_bool,&bv);
                          }
                          iVar4 = je_mallctl("opt.abort_conf",&bv,&bsz,(void *)0x0,0);
                          if (iVar4 == 0) {
                            emitter_kv(&emitter,"abort_conf","opt.abort_conf",emitter_type_bool,&bv)
                            ;
                          }
                          iVar4 = je_mallctl("opt.confirm_conf",&bv,&bsz,(void *)0x0,0);
                          if (iVar4 == 0) {
                            emitter_kv(&emitter,"confirm_conf","opt.confirm_conf",emitter_type_bool,
                                       &bv);
                          }
                          iVar4 = je_mallctl("opt.retain",&bv,&bsz,(void *)0x0,0);
                          if (iVar4 == 0) {
                            emitter_kv(&emitter,"retain","opt.retain",emitter_type_bool,&bv);
                          }
                          iVar4 = je_mallctl("opt.dss",&cpv,&cpsz,(void *)0x0,0);
                          if (iVar4 == 0) {
                            emitter_kv(&emitter,"dss","opt.dss",emitter_type_string,&cpv);
                          }
                          iVar4 = je_mallctl("opt.narenas",&uv,&usz,(void *)0x0,0);
                          if (iVar4 == 0) {
                            emitter_kv(&emitter,"narenas","opt.narenas",emitter_type_unsigned,&uv);
                          }
                          iVar4 = je_mallctl("opt.percpu_arena",&cpv,&cpsz,(void *)0x0,0);
                          if (iVar4 == 0) {
                            emitter_kv(&emitter,"percpu_arena","opt.percpu_arena",
                                       emitter_type_string,&cpv);
                          }
                          iVar4 = je_mallctl("opt.oversize_threshold",&sv,&ssz,(void *)0x0,0);
                          if (iVar4 == 0) {
                            emitter_kv(&emitter,"oversize_threshold","opt.oversize_threshold",
                                       emitter_type_size,&sv);
                          }
                          iVar4 = je_mallctl("opt.metadata_thp",&cpv,&cpsz,(void *)0x0,0);
                          if (iVar4 == 0) {
                            emitter_kv(&emitter,"metadata_thp","opt.metadata_thp",
                                       emitter_type_string,&cpv);
                          }
                          iVar4 = je_mallctl("opt.background_thread",&bv,&bsz,(void *)0x0,0);
                          if (iVar4 == 0) {
                            iVar4 = je_mallctl("background_thread",&bv2,&bsz,(void *)0x0,0);
                            if (iVar4 == 0) {
                              emitter_kv_note(&emitter,"background_thread","opt.background_thread",
                                              emitter_type_bool,&bv,"background_thread",
                                              emitter_type_bool,&bv2);
                            }
                          }
                          iVar4 = je_mallctl("opt.dirty_decay_ms",&ssv,&sssz,(void *)0x0,0);
                          if (iVar4 == 0) {
                            iVar4 = je_mallctl("arenas.dirty_decay_ms",&ssv2,&sssz,(void *)0x0,0);
                            if (iVar4 == 0) {
                              emitter_kv_note(&emitter,"dirty_decay_ms","opt.dirty_decay_ms",
                                              emitter_type_ssize,&ssv,"arenas.dirty_decay_ms",
                                              emitter_type_ssize,&ssv2);
                            }
                          }
                          iVar4 = je_mallctl("opt.muzzy_decay_ms",&ssv,&sssz,(void *)0x0,0);
                          if (iVar4 == 0) {
                            iVar4 = je_mallctl("arenas.muzzy_decay_ms",&ssv2,&sssz,(void *)0x0,0);
                            if (iVar4 == 0) {
                              emitter_kv_note(&emitter,"muzzy_decay_ms","opt.muzzy_decay_ms",
                                              emitter_type_ssize,&ssv,"arenas.muzzy_decay_ms",
                                              emitter_type_ssize,&ssv2);
                            }
                          }
                          iVar4 = je_mallctl("opt.lg_extent_max_active_fit",&sv,&ssz,(void *)0x0,0);
                          if (iVar4 == 0) {
                            emitter_kv(&emitter,"lg_extent_max_active_fit",
                                       "opt.lg_extent_max_active_fit",emitter_type_size,&sv);
                          }
                          iVar4 = je_mallctl("opt.junk",&cpv,&cpsz,(void *)0x0,0);
                          if (iVar4 == 0) {
                            emitter_kv(&emitter,"junk","opt.junk",emitter_type_string,&cpv);
                          }
                          iVar4 = je_mallctl("opt.zero",&bv,&bsz,(void *)0x0,0);
                          if (iVar4 == 0) {
                            emitter_kv(&emitter,"zero","opt.zero",emitter_type_bool,&bv);
                          }
                          iVar4 = je_mallctl("opt.utrace",&bv,&bsz,(void *)0x0,0);
                          if (iVar4 == 0) {
                            emitter_kv(&emitter,"utrace","opt.utrace",emitter_type_bool,&bv);
                          }
                          iVar4 = je_mallctl("opt.xmalloc",&bv,&bsz,(void *)0x0,0);
                          if (iVar4 == 0) {
                            emitter_kv(&emitter,"xmalloc","opt.xmalloc",emitter_type_bool,&bv);
                          }
                          iVar4 = je_mallctl("opt.tcache",&bv,&bsz,(void *)0x0,0);
                          if (iVar4 == 0) {
                            emitter_kv(&emitter,"tcache","opt.tcache",emitter_type_bool,&bv);
                          }
                          iVar4 = je_mallctl("opt.lg_tcache_max",&ssv,&sssz,(void *)0x0,0);
                          if (iVar4 == 0) {
                            emitter_kv(&emitter,"lg_tcache_max","opt.lg_tcache_max",
                                       emitter_type_ssize,&ssv);
                          }
                          iVar4 = je_mallctl("opt.thp",&cpv,&cpsz,(void *)0x0,0);
                          if (iVar4 == 0) {
                            emitter_kv(&emitter,"thp","opt.thp",emitter_type_string,&cpv);
                          }
                          iVar4 = je_mallctl("opt.prof",&bv,&bsz,(void *)0x0,0);
                          if (iVar4 == 0) {
                            emitter_kv(&emitter,"prof","opt.prof",emitter_type_bool,&bv);
                          }
                          iVar4 = je_mallctl("opt.prof_prefix",&cpv,&cpsz,(void *)0x0,0);
                          if (iVar4 == 0) {
                            emitter_kv(&emitter,"prof_prefix","opt.prof_prefix",emitter_type_string,
                                       &cpv);
                          }
                          iVar4 = je_mallctl("opt.prof_active",&bv,&bsz,(void *)0x0,0);
                          if (iVar4 == 0) {
                            iVar4 = je_mallctl("prof.active",&bv2,&bsz,(void *)0x0,0);
                            if (iVar4 == 0) {
                              emitter_kv_note(&emitter,"prof_active","opt.prof_active",
                                              emitter_type_bool,&bv,"prof.active",emitter_type_bool,
                                              &bv2);
                            }
                          }
                          iVar4 = je_mallctl("opt.prof_thread_active_init",&bv,&bsz,(void *)0x0,0);
                          if (iVar4 == 0) {
                            iVar4 = je_mallctl("prof.thread_active_init",&bv2,&bsz,(void *)0x0,0);
                            if (iVar4 == 0) {
                              emitter_kv_note(&emitter,"prof_thread_active_init",
                                              "opt.prof_thread_active_init",emitter_type_bool,&bv,
                                              "prof.thread_active_init",emitter_type_bool,&bv2);
                            }
                          }
                          iVar4 = je_mallctl("opt.lg_prof_sample",&ssv,&sssz,(void *)0x0,0);
                          if (iVar4 == 0) {
                            iVar4 = je_mallctl("prof.lg_sample",&ssv2,&sssz,(void *)0x0,0);
                            if (iVar4 == 0) {
                              emitter_kv_note(&emitter,"lg_prof_sample","opt.lg_prof_sample",
                                              emitter_type_ssize,&ssv,"prof.lg_sample",
                                              emitter_type_ssize,&ssv2);
                            }
                          }
                          iVar4 = je_mallctl("opt.prof_accum",&bv,&bsz,(void *)0x0,0);
                          if (iVar4 == 0) {
                            emitter_kv(&emitter,"prof_accum","opt.prof_accum",emitter_type_bool,&bv)
                            ;
                          }
                          iVar4 = je_mallctl("opt.lg_prof_interval",&ssv,&sssz,(void *)0x0,0);
                          if (iVar4 == 0) {
                            emitter_kv(&emitter,"lg_prof_interval","opt.lg_prof_interval",
                                       emitter_type_ssize,&ssv);
                          }
                          iVar4 = je_mallctl("opt.prof_gdump",&bv,&bsz,(void *)0x0,0);
                          if (iVar4 == 0) {
                            emitter_kv(&emitter,"prof_gdump","opt.prof_gdump",emitter_type_bool,&bv)
                            ;
                          }
                          iVar4 = je_mallctl("opt.prof_final",&bv,&bsz,(void *)0x0,0);
                          if (iVar4 == 0) {
                            emitter_kv(&emitter,"prof_final","opt.prof_final",emitter_type_bool,&bv)
                            ;
                          }
                          iVar4 = je_mallctl("opt.prof_leak",&bv,&bsz,(void *)0x0,0);
                          if (iVar4 == 0) {
                            emitter_kv(&emitter,"prof_leak","opt.prof_leak",emitter_type_bool,&bv);
                          }
                          iVar4 = je_mallctl("opt.stats_print",&bv,&bsz,(void *)0x0,0);
                          if (iVar4 == 0) {
                            emitter_kv(&emitter,"stats_print","opt.stats_print",emitter_type_bool,
                                       &bv);
                          }
                          iVar4 = je_mallctl("opt.stats_print_opts",&cpv,&cpsz,(void *)0x0,0);
                          if (iVar4 == 0) {
                            emitter_kv(&emitter,"stats_print_opts","opt.stats_print_opts",
                                       emitter_type_string,&cpv);
                          }
                          emitter_dict_end(&emitter);
                          emitter_json_object_kv_begin(&emitter,"arenas");
                          sz = 4;
                          iVar4 = je_mallctl("arenas.narenas",&uv,&sz,(void *)0x0,0);
                          if (iVar4 == 0) {
                            emitter_kv(&emitter,"narenas","Arenas",emitter_type_unsigned,&uv);
                            sz = 8;
                            iVar4 = je_mallctl("arenas.dirty_decay_ms",&ssv,&sz,(void *)0x0,0);
                            if (iVar4 == 0) {
                              emitter_json_kv(&emitter,"dirty_decay_ms",emitter_type_ssize,&ssv);
                              sz = 8;
                              iVar4 = je_mallctl("arenas.muzzy_decay_ms",&ssv,&sz,(void *)0x0,0);
                              if (iVar4 == 0) {
                                emitter_json_kv(&emitter,"muzzy_decay_ms",emitter_type_ssize,&ssv);
                                sz = 8;
                                iVar4 = je_mallctl("arenas.quantum",&sv,&sz,(void *)0x0,0);
                                if (iVar4 == 0) {
                                  emitter_kv(&emitter,"quantum","Quantum size",emitter_type_size,&sv
                                            );
                                  sz = 8;
                                  iVar4 = je_mallctl("arenas.page",&sv,&sz,(void *)0x0,0);
                                  if (iVar4 == 0) {
                                    emitter_kv(&emitter,"page","Page size",emitter_type_size,&sv);
                                    iVar4 = je_mallctl("arenas.tcache_max",&sv,&ssz,(void *)0x0,0);
                                    if (iVar4 == 0) {
                                      emitter_kv(&emitter,"tcache_max",
                                                 "Maximum thread-cached size class",
                                                 emitter_type_size,&sv);
                                    }
                                    sz = 4;
                                    iVar4 = je_mallctl("arenas.nbins",&nbins,&sz,(void *)0x0,0);
                                    if (iVar4 == 0) {
                                      emitter_kv(&emitter,"nbins","Number of bin size classes",
                                                 emitter_type_unsigned,&nbins);
                                      sz = 4;
                                      iVar4 = je_mallctl("arenas.nhbins",&nhbins,&sz,(void *)0x0,0);
                                      if (iVar4 == 0) {
                                        emitter_kv(&emitter,"nhbins",
                                                   "Number of thread-cache bin size classes",
                                                   emitter_type_unsigned,&nhbins);
                                        if (emitter.output == emitter_output_json) {
                                          local_d4 = (uint)uVar16;
                                          local_d8 = uVar15;
                                          emitter_json_array_kv_begin(&emitter,"bin");
                                          for (uVar16 = 0; uVar16 < nbins; uVar16 = uVar16 + 1) {
                                            emitter_json_object_begin(&emitter);
                                            miblen = 7;
                                            sz_19 = 8;
                                            iVar4 = je_mallctlnametomib("arenas.bin.0.size",&sz,
                                                                        &miblen);
                                            if (iVar4 != 0) {
                                              format = 
                                              "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                              ;
                                              pcVar6 = "arenas.bin.0.size";
                                              goto LAB_00135fd3;
                                            }
                                            local_88 = uVar16;
                                            iVar4 = je_mallctlbymib(&sz,miblen,&sv,&sz_19,
                                                                    (void *)0x0,0);
                                            if (iVar4 != 0) goto LAB_00135f74;
                                            emitter_json_kv(&emitter,"size",emitter_type_size,&sv);
                                            miblen = 7;
                                            sz_19 = 4;
                                            iVar4 = je_mallctlnametomib("arenas.bin.0.nregs",&sz,
                                                                        &miblen);
                                            if (iVar4 != 0) {
                                              format = 
                                              "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                              ;
                                              pcVar6 = "arenas.bin.0.nregs";
                                              goto LAB_00135fd3;
                                            }
                                            local_88 = uVar16;
                                            iVar4 = je_mallctlbymib(&sz,miblen,&u32v,&sz_19,
                                                                    (void *)0x0,0);
                                            if (iVar4 != 0) goto LAB_00135f74;
                                            emitter_json_kv(&emitter,"nregs",emitter_type_uint32,
                                                            &u32v);
                                            miblen = 7;
                                            sz_19 = 8;
                                            iVar4 = je_mallctlnametomib("arenas.bin.0.slab_size",&sz
                                                                        ,&miblen);
                                            if (iVar4 != 0) {
                                              format = 
                                              "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                              ;
                                              pcVar6 = "arenas.bin.0.slab_size";
                                              goto LAB_00135fd3;
                                            }
                                            local_88 = uVar16;
                                            iVar4 = je_mallctlbymib(&sz,miblen,&sv,&sz_19,
                                                                    (void *)0x0,0);
                                            if (iVar4 != 0) goto LAB_00135f74;
                                            emitter_json_kv(&emitter,"slab_size",emitter_type_size,
                                                            &sv);
                                            miblen = 7;
                                            sz_19 = 4;
                                            iVar4 = je_mallctlnametomib("arenas.bin.0.nshards",&sz,
                                                                        &miblen);
                                            if (iVar4 != 0) {
                                              format = 
                                              "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                              ;
                                              pcVar6 = "arenas.bin.0.nshards";
                                              goto LAB_00135fd3;
                                            }
                                            local_88 = uVar16;
                                            iVar4 = je_mallctlbymib(&sz,miblen,&u32v,&sz_19,
                                                                    (void *)0x0,0);
                                            if (iVar4 != 0) goto LAB_00135f74;
                                            emitter_json_kv(&emitter,"nshards",emitter_type_uint32,
                                                            &u32v);
                                            emitter_json_object_end(&emitter);
                                          }
                                          emitter_json_array_end(&emitter);
                                          uVar16 = (ulong)local_d4;
                                          uVar15 = local_d8;
                                        }
                                        sz = 4;
                                        iVar4 = je_mallctl("arenas.nlextents",&nlextents,&sz,
                                                           (void *)0x0,0);
                                        if (iVar4 == 0) {
                                          emitter_kv(&emitter,"nlextents",
                                                     "Number of large size classes",
                                                     emitter_type_unsigned,&nlextents);
                                          if (emitter.output == emitter_output_json) {
                                            local_d4 = (uint)uVar16;
                                            local_d8 = uVar15;
                                            emitter_json_array_kv_begin(&emitter,"lextent");
                                            for (uVar16 = 0; uVar16 < nlextents; uVar16 = uVar16 + 1
                                                ) {
                                              emitter_json_object_begin(&emitter);
                                              miblen = 7;
                                              sz_19 = 8;
                                              iVar4 = je_mallctlnametomib("arenas.lextent.0.size",
                                                                          &sz,&miblen);
                                              if (iVar4 != 0) {
                                                format = 
                                                "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                ;
                                                pcVar6 = "arenas.lextent.0.size";
                                                goto LAB_00135fd3;
                                              }
                                              local_88 = uVar16;
                                              iVar4 = je_mallctlbymib(&sz,miblen,&sv,&sz_19,
                                                                      (void *)0x0,0);
                                              if (iVar4 != 0) goto LAB_00135f74;
                                              emitter_json_kv(&emitter,"size",emitter_type_size,&sv)
                                              ;
                                              emitter_json_object_end(&emitter);
                                            }
                                            emitter_json_array_end(&emitter);
                                            uVar16 = (ulong)local_d4;
                                            uVar15 = local_d8;
                                          }
                                          emitter_json_object_end(&emitter);
                                          goto LAB_00135ed1;
                                        }
                                        format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
                                        pcVar6 = "arenas.nlextents";
                                      }
                                      else {
                                        format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
                                        pcVar6 = "arenas.nhbins";
                                      }
                                    }
                                    else {
                                      format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
                                      pcVar6 = "arenas.nbins";
                                    }
                                  }
                                  else {
                                    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
                                    pcVar6 = "arenas.page";
                                  }
                                }
                                else {
                                  format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
                                  pcVar6 = "arenas.quantum";
                                }
                              }
                              else {
                                format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
                                pcVar6 = "arenas.muzzy_decay_ms";
                              }
                            }
                            else {
                              format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
                              pcVar6 = "arenas.dirty_decay_ms";
                            }
                          }
                          else {
                            format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
                            pcVar6 = "arenas.narenas";
                          }
                        }
                        else {
                          format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
                          pcVar6 = "config.xmalloc";
                        }
                      }
                      else {
                        format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
                        pcVar6 = "config.utrace";
                      }
                    }
                    else {
                      format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
                      pcVar6 = "config.stats";
                    }
                  }
                  else {
                    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
                    pcVar6 = "config.prof_libunwind";
                  }
                }
                else {
                  format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
                  pcVar6 = "config.prof_libgcc";
                }
              }
              else {
                format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
                pcVar6 = "config.prof";
              }
            }
            else {
              format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
              pcVar6 = "config.opt_safety_checks";
            }
          }
          else {
            format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
            pcVar6 = "config.lazy_lock";
          }
        }
        else {
          format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
          pcVar6 = "config.fill";
        }
      }
      else {
        format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
        pcVar6 = "config.debug";
      }
    }
    else {
      format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar6 = "config.cache_oblivious";
    }
  }
  else {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar6 = "version";
  }
LAB_00135fd3:
  malloc_printf(format,pcVar6);
  abort();
}

Assistant:

void
stats_print(void (*write_cb)(void *, const char *), void *cbopaque,
    const char *opts) {
	int err;
	uint64_t epoch;
	size_t u64sz;
#define OPTION(o, v, d, s) bool v = d;
	STATS_PRINT_OPTIONS
#undef OPTION

	/*
	 * Refresh stats, in case mallctl() was called by the application.
	 *
	 * Check for OOM here, since refreshing the ctl cache can trigger
	 * allocation.  In practice, none of the subsequent mallctl()-related
	 * calls in this function will cause OOM if this one succeeds.
	 * */
	epoch = 1;
	u64sz = sizeof(uint64_t);
	err = je_mallctl("epoch", (void *)&epoch, &u64sz, (void *)&epoch,
	    sizeof(uint64_t));
	if (err != 0) {
		if (err == EAGAIN) {
			malloc_write("<jemalloc>: Memory allocation failure in "
			    "mallctl(\"epoch\", ...)\n");
			return;
		}
		malloc_write("<jemalloc>: Failure in mallctl(\"epoch\", "
		    "...)\n");
		abort();
	}

	if (opts != NULL) {
		for (unsigned i = 0; opts[i] != '\0'; i++) {
			switch (opts[i]) {
#define OPTION(o, v, d, s) case o: v = s; break;
				STATS_PRINT_OPTIONS
#undef OPTION
			default:;
			}
		}
	}

	emitter_t emitter;
	emitter_init(&emitter,
	    json ? emitter_output_json : emitter_output_table, write_cb,
	    cbopaque);
	emitter_begin(&emitter);
	emitter_table_printf(&emitter, "___ Begin jemalloc statistics ___\n");
	emitter_json_object_kv_begin(&emitter, "jemalloc");

	if (general) {
		stats_general_print(&emitter);
	}
	if (config_stats) {
		stats_print_helper(&emitter, merged, destroyed, unmerged,
		    bins, large, mutex, extents);
	}

	emitter_json_object_end(&emitter); /* Closes the "jemalloc" dict. */
	emitter_table_printf(&emitter, "--- End jemalloc statistics ---\n");
	emitter_end(&emitter);
}